

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

bool __thiscall cfd::core::AbstractTransaction::IsCoinBase(AbstractTransaction *this)

{
  int iVar1;
  size_t coinbase;
  size_t local_10;
  
  if ((wally_tx *)this->wally_tx_pointer_ != (wally_tx *)0x0) {
    local_10 = 0;
    iVar1 = wally_tx_is_coinbase((wally_tx *)this->wally_tx_pointer_,&local_10);
    return local_10 != 0 && iVar1 == 0;
  }
  return false;
}

Assistant:

bool AbstractTransaction::IsCoinBase() const {
  bool is_coinbase = false;
  struct wally_tx *tx = static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx != nullptr) {
    size_t coinbase = 0;
    int ret = wally_tx_is_coinbase(tx, &coinbase);
    if ((ret == WALLY_OK) && (coinbase != 0)) {
      is_coinbase = true;
    }
  }
  return is_coinbase;
}